

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

TestCase *
vkt::createFunctionCase<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>
          (TestContext *testCtx,TestNodeType type,string *name,string *desc,Function testFunction,
          Parameters *arg0)

{
  Parameters *func_;
  Function desc_00;
  string *name_00;
  TestNodeType type_00;
  TestContext *testCtx_00;
  InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args>_>
  *this;
  Parameters local_70;
  Args local_58;
  Parameters *local_38;
  Parameters *arg0_local;
  Function testFunction_local;
  string *desc_local;
  string *name_local;
  TestContext *pTStack_10;
  TestNodeType type_local;
  TestContext *testCtx_local;
  
  local_38 = arg0;
  arg0_local = (Parameters *)testFunction;
  testFunction_local = (Function)desc;
  desc_local = name;
  name_local._4_4_ = type;
  pTStack_10 = testCtx;
  this = (InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args>_>
          *)operator_new(0x98);
  testCtx_00 = pTStack_10;
  type_00 = name_local._4_4_;
  name_00 = desc_local;
  desc_00 = testFunction_local;
  func_ = arg0_local;
  api::anon_unknown_1::DescriptorSetLayout::Parameters::Parameters(&local_70,arg0);
  FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args::Args
            (&local_58,(Function)func_,&local_70);
  InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args>_>
  ::InstanceFactory1(this,testCtx_00,type_00,name_00,(string *)desc_00,&local_58);
  FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args::~Args
            (&local_58);
  api::anon_unknown_1::DescriptorSetLayout::Parameters::~Parameters(&local_70);
  return &this->super_TestCase;
}

Assistant:

TestCase* createFunctionCase (tcu::TestContext&								testCtx,
							  tcu::TestNodeType								type,
							  const std::string&							name,
							  const std::string&							desc,
							  typename FunctionInstance1<Arg0>::Function	testFunction,
							  Arg0											arg0)
{
	return new InstanceFactory1<FunctionInstance1<Arg0>, typename FunctionInstance1<Arg0>::Args>(
		testCtx, type, name, desc, typename FunctionInstance1<Arg0>::Args(testFunction, arg0));
}